

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_ObjSetCo(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int fFlopInput)

{
  int iVar1;
  int fFlopInput_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjId(p,pObj);
  Vec_IntPush(&p->vCos,iVar1);
  if (fFlopInput == 0) {
    iVar1 = Wlc_ObjId(p,pObj);
    Vec_IntPush(&p->vPos,iVar1);
    *(ushort *)pObj = *(ushort *)pObj & 0xfdff | 0x200;
  }
  else {
    *(ushort *)pObj = *(ushort *)pObj & 0xfbff | 0x400;
  }
  return;
}

Assistant:

void Wlc_ObjSetCo( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int fFlopInput )
{
//    pObj->Fanins[1] = Vec_IntSize(&p->vCos);
    Vec_IntPush( &p->vCos, Wlc_ObjId(p, pObj) );
    if ( !fFlopInput )
        Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
    if ( fFlopInput )
        pObj->fIsFi = 1;
    else
        pObj->fIsPo = 1;
}